

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O3

Triple * __thiscall llvm::Triple::get32BitArchVariant(Triple *__return_storage_ptr__,Triple *this)

{
  pointer pcVar1;
  ObjectFormatType OVar2;
  SubArchType SVar3;
  VendorType VVar4;
  OSType OVar5;
  size_t sVar6;
  char *pcVar7;
  StringRef Str;
  
  (__return_storage_ptr__->Data)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->Data).field_2
  ;
  pcVar1 = (this->Data)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->Data)._M_string_length);
  OVar2 = this->ObjectFormat;
  __return_storage_ptr__->Environment = this->Environment;
  __return_storage_ptr__->ObjectFormat = OVar2;
  SVar3 = this->SubArch;
  VVar4 = this->Vendor;
  OVar5 = this->OS;
  __return_storage_ptr__->Arch = this->Arch;
  __return_storage_ptr__->SubArch = SVar3;
  __return_storage_ptr__->Vendor = VVar4;
  __return_storage_ptr__->OS = OVar5;
  switch(this->Arch) {
  case UnknownArch:
  case avr:
  case bpfel:
  case bpfeb:
  case msp430:
  case ppc64le:
  case amdgcn:
  case systemz:
    pcVar7 = "unknown";
    goto LAB_00167b96;
  default:
    goto switchD_00167b8d_caseD_1;
  case aarch64:
    pcVar7 = "arm";
    sVar6 = 3;
    break;
  case aarch64_be:
    pcVar7 = "armeb";
    goto LAB_00167c22;
  case mips64:
    pcVar7 = "mips";
    goto LAB_00167c3c;
  case mips64el:
    pcVar7 = "mipsel";
    goto LAB_00167bc2;
  case ppc64:
    pcVar7 = "powerpc";
    goto LAB_00167b96;
  case riscv64:
    pcVar7 = "riscv32";
LAB_00167b96:
    sVar6 = 7;
    break;
  case sparcv9:
    pcVar7 = "sparc";
    goto LAB_00167c22;
  case x86_64:
    pcVar7 = "i386";
    goto LAB_00167c3c;
  case nvptx64:
    pcVar7 = "nvptx";
    goto LAB_00167c22;
  case le64:
    pcVar7 = "le32";
    goto LAB_00167c3c;
  case amdil64:
    pcVar7 = "amdil";
    goto LAB_00167c22;
  case hsail64:
    pcVar7 = "hsail";
LAB_00167c22:
    sVar6 = 5;
    break;
  case spir64:
    pcVar7 = "spir";
LAB_00167c3c:
    sVar6 = 4;
    break;
  case wasm64:
    pcVar7 = "wasm32";
LAB_00167bc2:
    sVar6 = 6;
    break;
  case LastArchType:
    pcVar7 = "renderscript32";
    sVar6 = 0xe;
  }
  Str.Length = sVar6;
  Str.Data = pcVar7;
  setArchName(__return_storage_ptr__,Str);
switchD_00167b8d_caseD_1:
  return __return_storage_ptr__;
}

Assistant:

Triple Triple::get32BitArchVariant() const {
  Triple T(*this);
  switch (getArch()) {
  case Triple::UnknownArch:
  case Triple::amdgcn:
  case Triple::avr:
  case Triple::bpfel:
  case Triple::bpfeb:
  case Triple::msp430:
  case Triple::systemz:
  case Triple::ppc64le:
    T.setArch(UnknownArch);
    break;

  case Triple::amdil:
  case Triple::hsail:
  case Triple::spir:
  case Triple::arc:
  case Triple::arm:
  case Triple::armeb:
  case Triple::hexagon:
  case Triple::kalimba:
  case Triple::le32:
  case Triple::mips:
  case Triple::mipsel:
  case Triple::nios2:
  case Triple::nvptx:
  case Triple::ppc:
  case Triple::r600:
  case Triple::riscv32:
  case Triple::sparc:
  case Triple::sparcel:
  case Triple::tce:
  case Triple::tcele:
  case Triple::thumb:
  case Triple::thumbeb:
  case Triple::x86:
  case Triple::xcore:
  case Triple::lanai:
  case Triple::shave:
  case Triple::wasm32:
  case Triple::renderscript32:
    // Already 32-bit.
    break;

  case Triple::aarch64:        T.setArch(Triple::arm);     break;
  case Triple::aarch64_be:     T.setArch(Triple::armeb);   break;
  case Triple::le64:           T.setArch(Triple::le32);    break;
  case Triple::mips64:         T.setArch(Triple::mips);    break;
  case Triple::mips64el:       T.setArch(Triple::mipsel);  break;
  case Triple::nvptx64:        T.setArch(Triple::nvptx);   break;
  case Triple::ppc64:          T.setArch(Triple::ppc);     break;
  case Triple::sparcv9:        T.setArch(Triple::sparc);   break;
  case Triple::riscv64:        T.setArch(Triple::riscv32); break;
  case Triple::x86_64:         T.setArch(Triple::x86);     break;
  case Triple::amdil64:        T.setArch(Triple::amdil);   break;
  case Triple::hsail64:        T.setArch(Triple::hsail);   break;
  case Triple::spir64:         T.setArch(Triple::spir);    break;
  case Triple::wasm64:         T.setArch(Triple::wasm32);  break;
  case Triple::renderscript64: T.setArch(Triple::renderscript32); break;
  }
  return T;
}